

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadInt64(ON_BinaryArchive *this,size_t count,ON__INT64 *p)

{
  size_t count_00;
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  ON__INT64 OVar4;
  size_t sVar5;
  size_t sVar6;
  
  count_00 = count * 8;
  sVar5 = Read(this,count_00,p);
  if ((count != 0 && sVar5 == count_00) && this->m_endian == big_endian) {
    sVar6 = 0;
    do {
      OVar4 = p[sVar6];
      *(undefined1 *)(p + sVar6) = *(undefined1 *)((long)p + sVar6 * 8 + 7);
      *(char *)((long)p + sVar6 * 8 + 7) = (char)OVar4;
      uVar2 = *(ushort *)((long)p + sVar6 * 8 + 1);
      uVar3 = *(ushort *)((long)p + sVar6 * 8 + 5);
      *(ushort *)((long)p + sVar6 * 8 + 1) = uVar3 << 8 | uVar3 >> 8;
      *(ushort *)((long)p + sVar6 * 8 + 5) = uVar2 << 8 | uVar2 >> 8;
      puVar1 = (ushort *)((long)p + sVar6 * 8 + 3);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      sVar6 = sVar6 + 1;
    } while (count != sVar6);
  }
  return sVar5 == count_00;
}

Assistant:

bool
ON_BinaryArchive::ReadInt64( // Read an array of 64 bit integers
		size_t count,            // number of 64 bit integers to read
		ON__INT64* p
		)
{
  bool rc = ReadByte( count<<3, p );
  if (rc && m_endian == ON::endian::big_endian)
  {
		unsigned char* b=(unsigned char*)p;
		unsigned char  c;
		while(count--) {
			c = b[0]; b[0] = b[7]; b[7] = c;
			c = b[1]; b[1] = b[6]; b[6] = c;
			c = b[2]; b[2] = b[5]; b[5] = c;
			c = b[3]; b[3] = b[4]; b[4] = c;
			b += 8;
		}
  }
  return rc;
}